

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QBGPlanner_TreeIncPruneBnB.cpp
# Opt level: O1

QFunctionsDiscrete * __thiscall
QBGPlanner_TreeIncPruneBnB::BackupStage
          (QFunctionsDiscrete *__return_storage_ptr__,QBGPlanner_TreeIncPruneBnB *this,
          QFunctionsDiscrete *Qs,size_t maxNrAlphas)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VectorSet *VS;
  multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *pmVar2;
  long lVar3;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *pvVar4;
  size_type sVar5;
  DecPOMDPDiscreteInterface *pDVar6;
  multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *pmVar7;
  multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>_>
  *pmVar8;
  MultiAgentDecisionProcessDiscreteInterface *pMVar9;
  AlphaVector *pAVar10;
  AlphaVector *pAVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  PlanningUnitDecPOMDPDiscrete *pPVar18;
  undefined8 uVar19;
  undefined4 extraout_var;
  size_type __n;
  ostream *poVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  AlphaVector *pAVar24;
  ulong uVar25;
  GaoVectorSetIndex aPrime;
  ulong uVar26;
  long lVar27;
  Index ja;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM2 [16];
  QFunctionsDiscrete *Q;
  AlphaVector alpha;
  ValueFunctionPOMDPDiscrete V;
  vector<AlphaVector,_std::allocator<AlphaVector>_> G;
  vector<AlphaVector,_std::allocator<AlphaVector>_> L;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  jpol;
  AlphaVector v1;
  GaoVectorSet Gao;
  AlphaVector local_308;
  string local_2e0;
  ulong local_2c0;
  ulong local_2b8;
  ValueFunctionPOMDPDiscrete local_2b0;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_298;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_278;
  size_t local_260;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_258;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [7];
  ios_base local_1b8 [264];
  GaoVectorSet local_b0;
  
  this->_m_nodes_visited = 0;
  this->_m_nr_bottom_hits = 0;
  this->_m_nr_backtracks = 0;
  local_b0.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_ = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            **)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_238,
             (ulong)this->_m_maxDepth,(value_type_conflict2 *)&local_b0,(allocator_type *)&local_308
            );
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::_M_move_assign
            (&this->_m_union_nodes_at_level,
             (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_238);
  if ((pointer)local_238._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity - local_238._0_8_);
  }
  local_b0.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_ = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            **)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_238,
             (ulong)this->_m_maxDepth,(value_type_conflict2 *)&local_b0,(allocator_type *)&local_308
            );
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::_M_move_assign
            (&this->_m_cs_nodes_at_level,
             (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_238);
  if ((pointer)local_238._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity - local_238._0_8_);
  }
  AlphaVectorPlanning::QFunctionsToValueFunction(&local_2b0,Qs);
  pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
              _m_puShared.px;
  }
  sVar15 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar18->super_PlanningUnitMADPDiscrete);
  pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
              _m_puShared.px;
  }
  uVar16 = (**(code **)((long)*(pPVar18->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
              _m_puShared.px;
  }
  uVar13 = (**(code **)((long)*(pPVar18->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TreeIncPruneBGPlanner::BackupStage computing all Gaoa vectors",
             0x3d);
  std::ostream::flush();
  local_260 = sVar15;
  AlphaVectorPlanning::BackProject(&local_b0,(AlphaVectorPlanning *)this,&local_2b0);
  local_2c0 = uVar16;
  if ((int)uVar16 != 0) {
    uVar26 = 0;
    do {
      if (uVar13 != 0) {
        uVar29 = 0;
        do {
          VS = local_b0.
               super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
               .
               super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               .base_[local_b0.
                      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                      .
                      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                      .origin_offset_ +
                      local_b0.
                      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                      .
                      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                      .stride_list_.elems[0] * uVar26 +
                      local_b0.
                      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                      .
                      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                      .stride_list_.elems[1] * uVar29];
          AlphaVectorPlanning::VectorSetToValueFunction
                    ((ValueFunctionPOMDPDiscrete *)&local_308,VS,0,-1);
          pmVar2 = this->_m_Gao_storage;
          lVar3 = (pmVar2->
                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                  ).
                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                  .origin_offset_;
          pvVar4 = (pmVar2->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .base_;
          lVar21 = (pmVar2->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .stride_list_.elems[0] * uVar26;
          lVar17 = (pmVar2->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .stride_list_.elems[1] * uVar29;
          local_238._0_8_ =
               pvVar4[lVar3 + lVar21 + lVar17].
               super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_238._8_8_ =
               pvVar4[lVar3 + lVar21 + lVar17].
               super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_228[0]._0_8_ =
               pvVar4[lVar3 + lVar21 + lVar17].
               super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          pvVar4[lVar3 + lVar21 + lVar17].
          super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_308._0_8_;
          pvVar4[lVar3 + lVar21 + lVar17].
          super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_308._m_betaI;
          pvVar4[lVar3 + lVar21 + lVar17].
          super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_308._m_values.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_308._0_8_ = (pointer)0x0;
          local_308._m_betaI = 0;
          local_308._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                    ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)local_238);
          std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                    ((ValueFunctionPOMDPDiscrete *)&local_308);
          sVar5 = (VS->data_).size_;
          if (sVar5 != 0) {
            operator_delete((VS->data_).data_,sVar5 << 3);
          }
          operator_delete(VS,0x28);
          uVar29 = uVar29 + 1;
        } while (uVar13 != uVar29);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uVar16 & 0xffffffff));
  }
  uVar16 = uVar16 & 0xffffffff;
  if (uVar16 != 0) {
    local_2b8 = (ulong)uVar13;
    uVar26 = 0;
    do {
      if (local_2b8 != 0) {
        uVar29 = 0;
        do {
          pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                    _m_pu;
          if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
            pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                      _m_puShared.px;
          }
          pDVar6 = pPVar18->_m_DecPOMDP;
          uVar31 = (**(code **)(*(long *)((long)&pDVar6->field_0x0 +
                                         *(long *)(*(long *)pDVar6 + -0xb0)) + 0x70))
                             ((long)&pDVar6->field_0x0 + *(long *)(*(long *)pDVar6 + -0xb0));
          if (local_2b0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_2b0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar23 = 0;
            do {
              pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                        super_AlphaVectorPlanning._m_pu;
              if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
                pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                          super_AlphaVectorPlanning._m_puShared.px;
              }
              sVar15 = PlanningUnitMADPDiscrete::GetNrStates
                                 (&pPVar18->super_PlanningUnitMADPDiscrete);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)&local_308,sVar15,
                         (allocator_type *)local_238);
              uVar28 = 0;
              while( true ) {
                pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                          super_AlphaVectorPlanning._m_pu;
                if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
                  pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                            super_AlphaVectorPlanning._m_puShared.px;
                }
                sVar15 = PlanningUnitMADPDiscrete::GetNrStates
                                   (&pPVar18->super_PlanningUnitMADPDiscrete);
                uVar30 = (ulong)uVar28;
                if (sVar15 == uVar30) break;
                pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                          super_AlphaVectorPlanning._m_pu;
                if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
                  pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                            super_AlphaVectorPlanning._m_puShared.px;
                }
                dVar32 = (double)(**(code **)(*(long *)pPVar18->_m_DecPOMDP + 0xc0))
                                           (pPVar18->_m_DecPOMDP,uVar30,uVar26 & 0xffffffff);
                pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                          super_AlphaVectorPlanning._m_pu;
                if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
                  pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                            super_AlphaVectorPlanning._m_puShared.px;
                }
                uVar19 = (**(code **)((long)*(pPVar18->super_PlanningUnitMADPDiscrete)._m_madp + 200
                                     ))();
                pmVar2 = this->_m_Gao_storage;
                lVar3 = (pmVar2->
                        super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                        ).
                        super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                        .origin_offset_;
                pvVar4 = (pmVar2->
                         super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                         ).
                         super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                         .base_;
                lVar27 = (pmVar2->
                         super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                         ).
                         super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                         .stride_list_.elems[0] * uVar26;
                lVar21 = (pmVar2->
                         super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                         ).
                         super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                         .stride_list_.elems[1] * uVar29;
                lVar17 = (long)pvVar4[lVar3 + lVar27 + lVar21].
                               super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl
                               .super__Vector_impl_data._M_start;
                uVar22 = ((long)pvVar4[lVar3 + lVar27 + lVar21].
                                super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                                _M_impl.super__Vector_impl_data._M_finish - lVar17 >> 3) *
                         -0x3333333333333333;
                uVar25 = uVar23;
                if ((uVar22 < uVar23 || uVar22 - uVar23 == 0) ||
                   (lVar3 = *(long *)(lVar17 + 0x10 + uVar23 * 0x28), uVar25 = uVar30,
                   (ulong)(*(long *)(lVar17 + 0x18 + uVar23 * 0x28) - lVar3 >> 3) <= uVar30)) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar25);
                }
                if ((ulong)(local_308._m_betaI - local_308._0_8_ >> 3) <= uVar30) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar30);
                }
                auVar12 = vcvtusi2sd_avx512f(in_XMM2,uVar19);
                auVar33._0_8_ = dVar32 / auVar12._0_8_;
                auVar33._8_8_ = 0;
                auVar34._8_8_ = 0;
                auVar34._0_8_ = uVar31;
                auVar12._8_8_ = 0;
                auVar12._0_8_ = *(ulong *)(lVar3 + uVar30 * 8);
                auVar12 = vfmadd231sd_fma(auVar33,auVar34,auVar12);
                *(long *)((Index *)local_308._0_8_ + uVar30 * 2) = auVar12._0_8_;
                uVar28 = uVar28 + 1;
              }
              pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                        super_AlphaVectorPlanning._m_pu;
              if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
                pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.
                          super_AlphaVectorPlanning._m_puShared.px;
              }
              sVar15 = PlanningUnitMADPDiscrete::GetNrStates
                                 (&pPVar18->super_PlanningUnitMADPDiscrete);
              AlphaVector::AlphaVector((AlphaVector *)local_238,sVar15);
              AlphaVector::SetValues
                        ((AlphaVector *)local_238,
                         (vector<double,_std::allocator<double>_> *)&local_308);
              local_238._0_4_ = (int)uVar26;
              pmVar7 = this->_m_Gaoa_storage;
              std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                        ((pmVar7->
                         super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                         ).
                         super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                         .base_ + (pmVar7->
                                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                                  ).
                                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                  .origin_offset_ +
                                  (pmVar7->
                                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                                  ).
                                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                  .stride_list_.elems[0] * uVar26 +
                                  (pmVar7->
                                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                                  ).
                                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                  .stride_list_.elems[1] * uVar29 +
                                  (ulong)local_2b0.
                                         super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar23]._m_action
                                  * (pmVar7->
                                    super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                                    ).
                                    super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                    .stride_list_.elems[2],(AlphaVector *)local_238);
              AlphaVector::~AlphaVector((AlphaVector *)local_238);
              if ((pointer)local_308._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_308._0_8_,
                                (long)local_308._m_values.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start - local_308._0_8_);
              }
              uVar23 = (ulong)((int)uVar23 + 1);
            } while (((long)local_2b0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2b0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 -
                     uVar23 != 0);
          }
          if ((int)local_2c0 != 0) {
            uVar31 = 0;
            do {
              pmVar7 = this->_m_Gaoa_storage;
              AlphaVectorPlanning::Prune
                        ((ValueFunctionPOMDPDiscrete *)&local_308,(AlphaVectorPlanning *)this,
                         (pmVar7->
                         super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                         ).
                         super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                         .base_ + (pmVar7->
                                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                                  ).
                                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                  .origin_offset_ +
                                  (pmVar7->
                                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                                  ).
                                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                  .stride_list_.elems[0] * uVar26 +
                                  (pmVar7->
                                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                                  ).
                                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                  .stride_list_.elems[1] * uVar29 +
                                  (pmVar7->
                                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                                  ).
                                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                  .stride_list_.elems[2] * uVar31);
              pmVar7 = this->_m_Gaoa_storage;
              lVar3 = (pmVar7->
                      super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                      ).
                      super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                      .origin_offset_;
              pvVar4 = (pmVar7->
                       super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                       ).
                       super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                       .base_;
              lVar21 = (pmVar7->
                       super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                       ).
                       super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                       .stride_list_.elems[0] * uVar26;
              lVar27 = (pmVar7->
                       super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                       ).
                       super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                       .stride_list_.elems[1] * uVar29;
              lVar17 = (pmVar7->
                       super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                       ).
                       super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                       .stride_list_.elems[2] * uVar31;
              local_238._0_8_ =
                   pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
                   super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_238._8_8_ =
                   pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
                   super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_228[0]._0_8_ =
                   pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
                   super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
              super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_308._0_8_;
              pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
              super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)local_308._m_betaI;
              pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
              super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_308._m_values.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              local_308._0_8_ = (pointer)0x0;
              local_308._m_betaI = 0;
              local_308._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                        ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)local_238);
              std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                        ((ValueFunctionPOMDPDiscrete *)&local_308);
              pmVar7 = this->_m_Gaoa_storage;
              pmVar8 = this->_m_Gaoa;
              (pmVar8->
              super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>).
              super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
              .base_[(pmVar8->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                     .origin_offset_ +
                     (pmVar8->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                     .stride_list_.elems[0] * uVar26 +
                     (pmVar8->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                     .stride_list_.elems[1] * uVar29 +
                     (pmVar8->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                     .stride_list_.elems[2] * uVar31] =
                   (pmVar7->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .base_ + (pmVar7->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .origin_offset_ +
                            (pmVar7->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[0] * uVar26 +
                            (pmVar7->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[1] * uVar29 +
                            (pmVar7->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[2] * uVar31;
              uVar31 = uVar31 + 1;
            } while (uVar16 != uVar31);
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != local_2b8);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," - total number of back-projected gamma vectors:",0x30);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  uVar29 = local_260 & 0xffffffff;
  AlphaVector::AlphaVector(&local_308,uVar29);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,uVar16,(allocator_type *)local_238);
  local_258.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar26 = 0;
  while( true ) {
    pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
    if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                _m_puShared.px;
    }
    iVar14 = (*(pPVar18->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])()
    ;
    if (CONCAT44(extraout_var,iVar14) == uVar26) break;
    pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
    if (pPVar18 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar18 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                _m_puShared.px;
    }
    pMVar9 = (pPVar18->super_PlanningUnitMADPDiscrete)._m_madp;
    __n = (**(code **)((long)*pMVar9 + 0xc0))(pMVar9,uVar26);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238,__n,
               &UNSPECIFIED_ACTION,(allocator_type *)&local_2e0);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&local_258,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238);
    if ((pointer)local_238._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity - local_238._0_8_);
    }
    uVar26 = (ulong)((int)uVar26 + 1);
  }
  if ((int)local_2c0 != 0) {
    paVar1 = &local_2e0.field_2;
    uVar26 = local_2c0 & 0xffffffff;
    uVar31 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n\n--------------------------------------\n",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-proceeding with a=",0x13);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"-------------------\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--------------------------------------\n\n",0x28);
      local_278.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::stringstream::stringstream((stringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_238 + 0x10),"ComputePOMDPheur_ts",0x13);
      std::ostream::operator<<
                ((ostream *)(local_238 + 0x10),
                 *(int *)&(this->super_MonahanBGPlanner).super_MonahanPlanner.
                          super_AlphaVectorPlanning.field_0x12c);
      std::__cxx11::stringbuf::str();
      Timing::Start(&this->_m_timing,&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      ja = (Index)uVar31;
      InitializeHeuristicsForJA(this,ja);
      std::__cxx11::stringbuf::str();
      Timing::Stop(&this->_m_timing,&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
      std::ios_base::~ios_base(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Heuristic initialized",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      local_298.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AlphaVector::AlphaVector((AlphaVector *)local_238,uVar29,0.0);
      local_238._0_4_ = ja;
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                (&local_298,(AlphaVector *)local_238);
      UnionNode(this,ja,0,&local_258,&local_278,&local_298);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar31,&local_278);
      SoftPrintStats_abi_cxx11_(&local_2e0,this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      AlphaVector::~AlphaVector((AlphaVector *)local_238);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_298);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_278);
      uVar31 = uVar31 + 1;
    } while (uVar31 != uVar26);
  }
  if (uVar16 != 0) {
    uVar26 = 0;
    do {
      if ((ulong)uVar13 != 0) {
        uVar29 = 0;
        do {
          pmVar2 = this->_m_Gao_storage;
          lVar3 = (pmVar2->
                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                  ).
                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                  .origin_offset_;
          pvVar4 = (pmVar2->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .base_;
          lVar21 = (pmVar2->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .stride_list_.elems[0] * uVar26;
          lVar17 = (pmVar2->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .stride_list_.elems[1] * uVar29;
          pAVar10 = pvVar4[lVar3 + lVar21 + lVar17].
                    super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pAVar11 = pvVar4[lVar3 + lVar21 + lVar17].
                    super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pAVar24 = pAVar10;
          if (pAVar11 != pAVar10) {
            do {
              AlphaVector::~AlphaVector(pAVar24);
              pAVar24 = pAVar24 + 1;
            } while (pAVar24 != pAVar11);
            pvVar4[lVar3 + lVar21 + lVar17].
            super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
            super__Vector_impl_data._M_finish = pAVar10;
          }
          uVar31 = 0;
          do {
            pmVar7 = this->_m_Gaoa_storage;
            lVar3 = (pmVar7->
                    super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                    ).
                    super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                    .origin_offset_;
            pvVar4 = (pmVar7->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                     .base_;
            lVar21 = (pmVar7->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                     .stride_list_.elems[0] * uVar26;
            lVar27 = (pmVar7->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                     .stride_list_.elems[1] * uVar29;
            lVar17 = (pmVar7->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                     .stride_list_.elems[2] * uVar31;
            pAVar10 = pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
                      super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pAVar11 = pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
                      super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pAVar24 = pAVar10;
            if (pAVar11 != pAVar10) {
              do {
                AlphaVector::~AlphaVector(pAVar24);
                pAVar24 = pAVar24 + 1;
              } while (pAVar24 != pAVar11);
              pvVar4[lVar3 + lVar21 + lVar27 + lVar17].
              super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
              super__Vector_impl_data._M_finish = pAVar10;
            }
            pmVar8 = this->_m_Gaoa;
            (pmVar8->
            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>).
            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
            .base_[(pmVar8->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                   .origin_offset_ +
                   (pmVar8->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                   .stride_list_.elems[0] * uVar26 +
                   (pmVar8->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                   .stride_list_.elems[1] * uVar29 +
                   (pmVar8->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                   .stride_list_.elems[2] * uVar31] =
                 (vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x0;
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar16);
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar13);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar16);
  }
  SoftPrintStats_abi_cxx11_((string *)local_238,this);
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_238._0_8_,local_238._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_228[0]._M_allocated_capacity + 1));
  }
  Timing::PrintSummary(&this->_m_timing);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_258);
  AlphaVector::~AlphaVector(&local_308);
  if (local_b0.base_ !=
      (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       **)0x0) {
    operator_delete(local_b0.base_,local_b0.allocated_elements_ << 3);
  }
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_2b0);
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
QBGPlanner_TreeIncPruneBnB::BackupStage(const QFunctionsDiscrete &Qs, size_t maxNrAlphas)
{
    _m_nr_bottom_hits = 0;
    _m_nr_backtracks = 0;
    _m_nodes_visited = 0;
    _m_union_nodes_at_level = vector<LIndex>(_m_maxDepth, 0);
    _m_cs_nodes_at_level = vector<LIndex>(_m_maxDepth, 0);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Qs);



//    vector<Index> jointActionOrder=GetJointActionOrder();

    Index nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations();
    cout << "TreeIncPruneBGPlanner::BackupStage computing all Gaoa vectors"; cout.flush();

    //because we will need both the POMDP vector sets as well as the QBG vector sets, 
    //we can better inline and addapt ComputeAllGaoa here
//    GaobetaVectorSet temp_Gaoa =  ComputeAllGaoa(V);
//    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
//        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
//            for(GaoVectorSetIndex aPrime=0;aPrime!=nrA;aPrime++) //for each next joint action
//            {
//                (*_m_Gaoa_storage)[a][o][aPrime] =  VectorSetToValueFunction( *temp_Gaoa[a][o][aPrime] );
//                (*_m_Gaoa)[a][o][aPrime] =  &(*_m_Gaoa_storage)[a][o][aPrime];
//            }

    //pre-compute the back-projected POMDP vector sets
    GaoVectorSet Gao=BackProject(V);
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            VectorSet * gao = Gao[a][o];
            (*_m_Gao_storage)[a][o] = VectorSetToValueFunction( *gao );
            delete gao;
        }
    //Note we cannot prune these Gao sets, since then we do not know to which 
    //vector V[i] Gao[a][o][i] corresponds. (and we need the in order to figure
    //out what next-stage action it specifies!)
    //TODO: but we can prune them later?

    //the following allocates space for the different sets G_{a,o,\beta} (i.e., (3.15) of the QBG-techrep)
    //GaobetaVectorSet G(boost::extents[nrA][nrO][nrA]);
    //-> No: We directly add to _m_Gaoa_storage

    size_t total_number_Gaoa = 0;
    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
        {
            //instead of 
            //  for aPrime = 1:nrA
            //      for vI = 1:nrVectors
            //          if vI.GetAction = aPrime
            //we just do
            //  for vI = 1:nrVectors
            //      G[a][o][vI.GetAction].push_back( vI)

            //a pointer used to point to different vectors in Gao
            double gamma=GetPU()->GetDiscount();
            for(Index vectorI=0; vectorI!=V.size(); vectorI++) // <- for each vector in Gao[a][o]
            // ( because Gao[a][o][i] is the backprojection of V[i], this is the same as for each 
            //   vector v[vectorI] in V^t+1 )
            {
                vector<double> v_temp(GetPU()->GetNrStates());
                //add the immediate reward (which is divided equally over the vectors)
                for(Index s=0; s!=GetPU()->GetNrStates(); s++)
                {
                    double R_s_a_o = (GetPU()->GetReward(s,a)) / GetPU()->GetNrJointObservations();
                    double g_a_o_v_s =  (*_m_Gao_storage)[a][o].at(vectorI).GetValue(s);
                    v_temp.at(s) =  R_s_a_o + gamma * g_a_o_v_s;
                }
                AlphaVector v1( GetPU()->GetNrStates() );
                v1.SetValues(v_temp);
                v1.SetAction(a);
                Index aPrime = V[vectorI].GetAction(); //<- Gao does not store the next-stage actions
                (*_m_Gaoa_storage)[a][o][aPrime].push_back(v1);
            }
            //prune:
            for(Index aPrime=0; aPrime < nrA; aPrime++)
            {
#if DEBUG_QBGPlanner_TreeIncPruneBnB
                cout << "_m_Gaoa_storage[a="<<a<<"][o="<<o<<"][a'="<<aPrime<<"]  =  ";
                cout <<  SoftPrintVector( (*_m_Gaoa_storage)[a][o][aPrime] ) << endl;
#endif
                (*_m_Gaoa_storage)[a][o][aPrime] = Prune( (*_m_Gaoa_storage)[a][o][aPrime] );
                (*_m_Gaoa)[a][o][aPrime] = &((*_m_Gaoa_storage)[a][o][aPrime]);

                size_t nr = (*_m_Gaoa_storage)[a][o][aPrime].size();
#if DEBUG_QBGPlanner_TreeIncPruneBnBVerbose
                cout << "_m_Gaoa_storage[a="<<a<<"][o="<<o<<"][a'="<<aPrime<<"]  has "<<
                    nr << " vectors\n";
#endif
                total_number_Gaoa += nr;
            }
        }

    cout << " - total number of back-projected gamma vectors:" << total_number_Gaoa;
    cout << "." << endl;

    AlphaVector alpha(nrS);
   
    //TODO: could save some time by passing this in as argument (by reference) 
    QFunctionsDiscrete Q(nrA);

    // Initialize a joint policy with all individual observations
    // mapping to UNSPECIFIED_ACTION
    vector<vector<Index> > jpol;
    for(Index k=0;k!=GetPU()->GetNrAgents();++k)
    {
        vector<Index> pol(GetPU()->GetNrObservations(k),UNSPECIFIED_ACTION);
        jpol.push_back(pol);
    }

    
    //
    // About the depths: we sync the 'depth index' with the index of the 
    // joint action vector that is being specified. E.g. the 
    // union node and subsequent cross-sum node that specify the joint 
    // action for the i-th entry of the joint action vector (JAV) representation
    // (of the CBG policy beta)  are at depth i.
    //
    // So we have a tree as follows:
    // node type    depth   comments
    // union        -1      the union over joint actions a at stage t. Not explicitly represented in code.
    // cross-sum    -1      the cross-sum that adds the R^a. Not explicitly represented in code 
    //                      (because R^a vectors are divided over the Gamma_a,o,a )
    // union        0       the union over joint actions a0' to be taken for the first joint observation o0.
    // cross-sum    0       the cross-sum of G_a,o1,a1 with the union at level 1.
    // ...
    // union        k-2     ('k' is _m_maxDepth in the code and corresponds to the number of joint observations)
    // cross-sum    k-2
    // union        k-1     the (degenerate) union over the only possible joint action a{k-1}'. 
    //                      In the bottom-up (memoizer) approach it just returns G_a,o{k-1},a{k-1}'.
    // cross-sum    k-1     Only exist in the top-down approach (BnB). Then it performs the last cross-sum
    //                      (with  G_a,o{k-1},a{k-1}') to create new set of (fully specified) lower-bound vectors that
    //                      are added to L.
    //
    // !!!Attention: there is a unfortunate notation clash here. 'G' is used to denote both back-projected vectors
    // (Gaoa, Ga etc.) as well as the set of vectors that induce the 'g-function' ! (it should usually be clear from
    // context)
    //

#if REUSELOWERBOUNDS
    //if we want to use lowerbounds of previous joint actions...
    //the set of non-dominated (lower bound) vectors found so far.
    std::vector<AlphaVector> L;
#endif
    // We loop over all joint actions in the current time step
    // In BnB, this can be interpreted as a union node! (at depth - 1)
    for(Index a=0; a != nrA; a++)
    {
//#if DEBUG_QBGPlanner_TreeIncPruneBnBVerbose
        cout << "\n\n--------------------------------------\n";
        cout << "-proceeding with a="<<a<<"-------------------\n";
        cout << "--------------------------------------\n\n";
//#endif
        //the set of non-dominated (lower bound) vectors found so far.
        //(i.e., we do not prune using lowerbounds of previous joint actions)
#if ! REUSELOWERBOUNDS
        std::vector<AlphaVector> L;
#endif

        //Initialize the heuristics for this a:
        {
            stringstream ss;
            ss << "ComputePOMDPheur_ts" << GetTimeStep();
            _m_timing.Start(ss.str());
            InitializeHeuristicsForJA(a);
            _m_timing.Stop(ss.str());
        }
        cout << "Heuristic initialized" << endl;
        //The vectorset representing the implied g-function.
        //It is initialized to contain the null vector.
        std::vector<AlphaVector> G;
        AlphaVector null_vec(nrS, 0.0 );
        null_vec.SetAction(a);
        G.push_back(null_vec);

        // we don't start with CrossSum as the reward is already in Gaoa
        UnionNode(a,0,jpol, L, G);

        //TODO: check if this is not necessary:
        //L = Prune(L);

        //Frans 20111005: euhm...? this confuses me plenty. The set of vectors in L (Ga in memoization version)
        //correspond to all kind of different betaI. Really we would need to track the indices along with the
        //vectors...?!

        //AlphaVector::BGPolicyIndex betaI=-1; // NEED TO FIGURE OUT BETAI DOWN THE TREE SOMEHOW - TODO
        //Q[a]=VectorSetToValueFunction(L,a,betaI); //<- No, L now contains vectors for all actions.
#if !REUSELOWERBOUNDS
        Q[a] = L;
#endif
        //Q[a] = Prune(L);
        cout << SoftPrintStats();
    }
#if REUSELOWERBOUNDS
    //  On second though, I'm not sure if we can prune using lower bounds of other actions.
    //  (gives e.g., BackupStage finished, returning Q=
    //      < < a 0 bI -1 : values -4 -4 >, <  >, <  >, <  >, <  >, <  >, <  >, <  >, <  > >
    //  )

    //sort the vectors per action:
    for(Index lvecI=0; lvecI < L.size(); lvecI++)
    {
        AlphaVector lvec = L[lvecI];
        Index a =  lvec.GetAction();
        if (a > nrA)
        {
            stringstream ss; ss << "ERROR: action index=%d!?!" << a << endl;
            throw E(ss);
        }
        Q[ a ].push_back(lvec);
    }
#endif    

    //clean up:
    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
        {
            (*_m_Gao_storage)[a][o].clear();
            for(GaoVectorSetIndex aPrime=0;aPrime!=nrA;aPrime++) //for each next joint a
            {
                (*_m_Gaoa_storage)[a][o][aPrime].clear();
                (*_m_Gaoa)[a][o][aPrime] = 0; //not necessary I think, but shouldn't hurt
            }
        }

#if DEBUG_QBGPlanner_TreeIncPruneBnB
    cout << "BackupStage finished, returning Q=\n";
    for(Index a=0; a != nrA; a++)
        cout << "a=" << a << " - " << PrintTools::SoftPrintVector(Q[a]) << endl;
#endif
    cout << SoftPrintStats() << endl;
    
    _m_timing.PrintSummary();
    cout << endl;

    return(Q);
}